

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O0

void __thiscall CovarianceMatrix::modelToQueries(CovarianceMatrix *this)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  byte bVar2;
  void *pvVar3;
  size_t *psVar4;
  element_type *peVar5;
  undefined8 *puVar6;
  long in_RDI;
  Query *quad_v2;
  Aggregate *agg_quad_v2;
  prod_bitset prod_quad_v2;
  size_t var2;
  Query *linear_1;
  Aggregate *agg_linear_1;
  Query *quad;
  Aggregate *agg_quad;
  Query *linear;
  Aggregate *agg_linear;
  prod_bitset prod_quad_v1;
  prod_bitset prod_linear_v1;
  size_t var_2;
  size_t cont_var_root;
  size_t numberOfQueries;
  Query *count;
  Aggregate *agg_count;
  size_t var_1;
  size_t var;
  size_t quadFeatureToFunction [100];
  size_t featureToFunction [100];
  size_t numberOfFunctions;
  undefined6 in_stack_fffffffffffff478;
  byte in_stack_fffffffffffff47e;
  byte in_stack_fffffffffffff47f;
  QueryCompiler *in_stack_fffffffffffff480;
  value_type *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff490;
  byte in_stack_fffffffffffff497;
  allocator_type *in_stack_fffffffffffff4c0;
  undefined6 in_stack_fffffffffffff4c8;
  undefined1 in_stack_fffffffffffff4ce;
  undefined1 in_stack_fffffffffffff4cf;
  Function *in_stack_fffffffffffff4d0;
  iterator in_stack_fffffffffffff4d8;
  size_type in_stack_fffffffffffff4e0;
  reference local_ad8;
  reference local_ac8;
  QueryCompiler *local_ab8;
  value_type *local_ab0;
  undefined1 local_aa8 [192];
  reference local_9e8;
  ulong local_9d8;
  undefined8 *local_9d0;
  void *local_9c8;
  size_t *local_9c0;
  void *local_9b8;
  size_t *local_9b0;
  void *local_9a8;
  reference local_9a0 [13];
  undefined1 local_8d0 [192];
  reference local_810;
  ulong local_800;
  size_t local_7f8;
  long local_7f0;
  size_t *local_7e8;
  void *local_720;
  undefined1 local_713;
  ulong local_710;
  ulong *local_708;
  undefined8 local_700;
  ulong local_6c8;
  undefined1 local_6bd;
  ulong local_6a8;
  ulong *local_6a0;
  undefined8 local_698;
  ulong local_660;
  long alStack_658 [100];
  long alStack_338 [101];
  long local_10;
  
  local_10 = 0;
  for (local_660 = 0; local_660 < 100; local_660 = local_660 + 1) {
    bVar1 = std::bitset<100UL>::test
                      ((bitset<100UL> *)in_stack_fffffffffffff480,
                       CONCAT17(in_stack_fffffffffffff47f,
                                CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
    if ((bVar1) &&
       (bVar1 = std::bitset<100UL>::test
                          ((bitset<100UL> *)in_stack_fffffffffffff480,
                           CONCAT17(in_stack_fffffffffffff47f,
                                    CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478))),
       !bVar1)) {
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x24accd);
      operator_new(0x48);
      local_6bd = 1;
      local_6a8 = local_660;
      local_6a0 = &local_6a8;
      local_698 = 1;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x24ad30);
      __l._M_len = in_stack_fffffffffffff4e0;
      __l._M_array = in_stack_fffffffffffff4d8;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff4d0,__l,
                 (less<unsigned_long> *)
                 CONCAT17(in_stack_fffffffffffff4cf,
                          CONCAT16(in_stack_fffffffffffff4ce,in_stack_fffffffffffff4c8)),
                 in_stack_fffffffffffff4c0);
      Function::Function(in_stack_fffffffffffff4d0,
                         (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)CONCAT17(in_stack_fffffffffffff4cf,
                                     CONCAT16(in_stack_fffffffffffff4ce,in_stack_fffffffffffff4c8)),
                         (Operation)((ulong)in_stack_fffffffffffff4c0 >> 0x20));
      local_6bd = 0;
      QueryCompiler::addFunction
                (in_stack_fffffffffffff480,
                 (Function *)
                 CONCAT17(in_stack_fffffffffffff47f,
                          CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 0x24ada7);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x24adb4);
      alStack_338[local_660] = local_10;
      local_10 = local_10 + 1;
    }
  }
  for (local_6c8 = 0; local_6c8 < 100; local_6c8 = local_6c8 + 1) {
    bVar1 = std::bitset<100UL>::test
                      ((bitset<100UL> *)in_stack_fffffffffffff480,
                       CONCAT17(in_stack_fffffffffffff47f,
                                CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
    if ((bVar1) &&
       (bVar1 = std::bitset<100UL>::test
                          ((bitset<100UL> *)in_stack_fffffffffffff480,
                           CONCAT17(in_stack_fffffffffffff47f,
                                    CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478))),
       !bVar1)) {
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x24aed1);
      operator_new(0x48);
      local_713 = 1;
      local_710 = local_6c8;
      local_708 = &local_710;
      local_700 = 1;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x24af31);
      __l_00._M_len = in_stack_fffffffffffff4e0;
      __l_00._M_array = in_stack_fffffffffffff4d8;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff4d0,__l_00,
                 (less<unsigned_long> *)
                 CONCAT17(in_stack_fffffffffffff4cf,
                          CONCAT16(in_stack_fffffffffffff4ce,in_stack_fffffffffffff4c8)),
                 in_stack_fffffffffffff4c0);
      Function::Function(in_stack_fffffffffffff4d0,
                         (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)CONCAT17(in_stack_fffffffffffff4cf,
                                     CONCAT16(in_stack_fffffffffffff4ce,in_stack_fffffffffffff4c8)),
                         (Operation)((ulong)in_stack_fffffffffffff4c0 >> 0x20));
      local_713 = 0;
      QueryCompiler::addFunction
                (in_stack_fffffffffffff480,
                 (Function *)
                 CONCAT17(in_stack_fffffffffffff47f,
                          CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 0x24afa5);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x24afb2);
      alStack_658[local_6c8] = local_10;
      local_10 = local_10 + 1;
    }
  }
  pvVar3 = operator_new(0x30);
  Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffff480);
  local_720 = pvVar3;
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x24b0a5);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_fffffffffffff480,
             (value_type *)
             CONCAT17(in_stack_fffffffffffff47f,
                      CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
  psVar4 = (size_t *)operator_new(0x30);
  Query::Query((Query *)in_stack_fffffffffffff480);
  local_7e8 = psVar4;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
            ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
             CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (value_type *)in_stack_fffffffffffff488);
  peVar5 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24b10a);
  *local_7e8 = peVar5->_root->_id;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x24b12d);
  QueryCompiler::addQuery
            (in_stack_fffffffffffff480,
             (Query *)CONCAT17(in_stack_fffffffffffff47f,
                               CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
  std::vector<Query_*,_std::allocator<Query_*>_>::push_back
            ((vector<Query_*,_std::allocator<Query_*>_> *)
             CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (value_type *)in_stack_fffffffffffff488);
  local_7f0 = 0;
  peVar5 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24b179);
  local_7f8 = peVar5->_root->_id;
  for (local_800 = 0; local_800 < 100; local_800 = local_800 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff480);
    bVar2 = bVar1 ^ 0xff;
    std::bitset<100UL>::reference::~reference(&local_810);
    if ((bVar2 & 1) == 0) {
      std::bitset<1500UL>::bitset((bitset<1500UL> *)0x24b246);
      std::bitset<1500UL>::bitset((bitset<1500UL> *)0x24b253);
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff480);
      bVar2 = bVar1 ^ 0xff;
      std::bitset<100UL>::reference::~reference(local_9a0);
      if ((bVar2 & 1) == 0) {
        pvVar3 = operator_new(0x30);
        Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffff480);
        local_9c8 = pvVar3;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   in_stack_fffffffffffff488);
        puVar6 = (undefined8 *)operator_new(0x30);
        Query::Query((Query *)in_stack_fffffffffffff480);
        local_9d0 = puVar6;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                  ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (value_type *)in_stack_fffffffffffff488);
        std::bitset<100UL>::set
                  ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (size_t)in_stack_fffffffffffff488,
                   SUB81((ulong)in_stack_fffffffffffff480 >> 0x38,0));
        *local_9d0 = *(undefined8 *)(*(long *)(in_RDI + 0xa8) + local_800 * 8);
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x24b620);
        QueryCompiler::addQuery
                  (in_stack_fffffffffffff480,
                   (Query *)CONCAT17(in_stack_fffffffffffff47f,
                                     CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)))
        ;
        std::vector<Query_*,_std::allocator<Query_*>_>::push_back
                  ((vector<Query_*,_std::allocator<Query_*>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (value_type *)in_stack_fffffffffffff488);
      }
      else {
        std::bitset<1500UL>::set
                  ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (size_t)in_stack_fffffffffffff488,
                   SUB81((ulong)in_stack_fffffffffffff480 >> 0x38,0));
        pvVar3 = operator_new(0x30);
        Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffff480);
        local_9a8 = pvVar3;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   in_stack_fffffffffffff488);
        psVar4 = (size_t *)operator_new(0x30);
        Query::Query((Query *)in_stack_fffffffffffff480);
        local_9b0 = psVar4;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                  ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (value_type *)in_stack_fffffffffffff488);
        *local_9b0 = local_7f8;
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x24b36a);
        QueryCompiler::addQuery
                  (in_stack_fffffffffffff480,
                   (Query *)CONCAT17(in_stack_fffffffffffff47f,
                                     CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)))
        ;
        std::vector<Query_*,_std::allocator<Query_*>_>::push_back
                  ((vector<Query_*,_std::allocator<Query_*>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (value_type *)in_stack_fffffffffffff488);
        local_7f0 = local_7f0 + 1;
        std::bitset<1500UL>::set
                  ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (size_t)in_stack_fffffffffffff488,
                   SUB81((ulong)in_stack_fffffffffffff480 >> 0x38,0));
        pvVar3 = operator_new(0x30);
        Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffff480);
        local_9b8 = pvVar3;
        std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                  ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   in_stack_fffffffffffff488);
        psVar4 = (size_t *)operator_new(0x30);
        Query::Query((Query *)in_stack_fffffffffffff480);
        local_9c0 = psVar4;
        std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                  ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (value_type *)in_stack_fffffffffffff488);
        peVar5 = std::
                 __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24b45f);
        *local_9c0 = peVar5->_root->_id;
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x24b482);
        QueryCompiler::addQuery
                  (in_stack_fffffffffffff480,
                   (Query *)CONCAT17(in_stack_fffffffffffff47f,
                                     CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)))
        ;
        std::vector<Query_*,_std::allocator<Query_*>_>::push_back
                  ((vector<Query_*,_std::allocator<Query_*>_> *)
                   CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                   (value_type *)in_stack_fffffffffffff488);
      }
      local_7f0 = local_7f0 + 1;
      local_9d8 = local_800;
      while (local_9d8 = local_9d8 + 1, local_9d8 < 100) {
        std::bitset<100UL>::operator[]
                  ((bitset<100UL> *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480);
        in_stack_fffffffffffff497 =
             std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff480);
        std::bitset<100UL>::reference::~reference(&local_9e8);
        if ((in_stack_fffffffffffff497 & 1) != 0) {
          memcpy(local_aa8,local_8d0,0xc0);
          in_stack_fffffffffffff488 = (value_type *)operator_new(0x30);
          Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffff480);
          local_ab0 = in_stack_fffffffffffff488;
          in_stack_fffffffffffff480 = (QueryCompiler *)operator_new(0x30);
          Query::Query((Query *)in_stack_fffffffffffff480);
          local_ab8 = in_stack_fffffffffffff480;
          peVar5 = std::
                   __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x24b797);
          (local_ab8->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)peVar5->_root->_id;
          std::bitset<100UL>::operator[]
                    ((bitset<100UL> *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480);
          in_stack_fffffffffffff47f =
               std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff480)
          ;
          std::bitset<100UL>::reference::~reference(&local_ac8);
          if ((in_stack_fffffffffffff47f & 1) != 0) {
            (local_ab8->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = *(element_type **)(*(long *)(in_RDI + 0xa8) + local_800 * 8);
            std::bitset<100UL>::set
                      ((bitset<100UL> *)
                       CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                       (size_t)in_stack_fffffffffffff488,
                       SUB81((ulong)in_stack_fffffffffffff480 >> 0x38,0));
          }
          std::bitset<100UL>::operator[]
                    ((bitset<100UL> *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480);
          in_stack_fffffffffffff47e =
               std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff480)
          ;
          std::bitset<100UL>::reference::~reference(&local_ad8);
          bVar1 = SUB81((ulong)in_stack_fffffffffffff480 >> 0x38,0);
          if ((in_stack_fffffffffffff47e & 1) == 0) {
            std::bitset<1500UL>::set
                      ((bitset<1500UL> *)
                       CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                       (size_t)in_stack_fffffffffffff488,bVar1);
          }
          else {
            std::bitset<100UL>::set
                      ((bitset<100UL> *)
                       CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                       (size_t)in_stack_fffffffffffff488,bVar1);
            (local_ab8->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = *(element_type **)(*(long *)(in_RDI + 0xa8) + local_9d8 * 8);
          }
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                    ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     in_stack_fffffffffffff488);
          std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                    ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                     CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     (value_type *)in_stack_fffffffffffff488);
          std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x24b977);
          QueryCompiler::addQuery
                    (in_stack_fffffffffffff480,
                     (Query *)CONCAT17(in_stack_fffffffffffff47f,
                                       CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)
                                      ));
          std::vector<Query_*,_std::allocator<Query_*>_>::push_back
                    ((vector<Query_*,_std::allocator<Query_*>_> *)
                     CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                     (value_type *)in_stack_fffffffffffff488);
          local_7f0 = local_7f0 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void CovarianceMatrix::modelToQueries()
{
    size_t numberOfFunctions = 0;
    size_t featureToFunction[NUM_OF_VARIABLES],
        quadFeatureToFunction[NUM_OF_VARIABLES];
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::sum));
            featureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::quadratic_sum));
            quadFeatureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    Aggregate* agg_count = new Aggregate();
    agg_count->_agg.push_back(prod_bitset());
            
    Query* count = new Query();
    count->_aggregates.push_back(agg_count);
    count->_rootID = _td->_root->_id;
    _compiler->addQuery(count);
    listOfQueries.push_back(count);    
    
    size_t numberOfQueries = 0;
    size_t cont_var_root = _td->_root->_id;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;
        
        prod_bitset prod_linear_v1;
        prod_bitset prod_quad_v1;

        if (!_categoricalFeatures[var])
        {
            // Linear function per Feature 
            prod_linear_v1.set(featureToFunction[var]);
 
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_rootID = cont_var_root;

            _compiler->addQuery(linear);
            
            listOfQueries.push_back(linear);            
            ++numberOfQueries;            
            
            // Quadratic function for each feature
            prod_quad_v1.set(quadFeatureToFunction[var]);
            
            Aggregate* agg_quad = new Aggregate();
            agg_quad->_agg.push_back(prod_quad_v1);
            
            Query* quad = new Query();
            quad->_aggregates.push_back(agg_quad);
            quad->_rootID = _td->_root->_id; // cont_var_root;

            _compiler->addQuery(quad);
            
            listOfQueries.push_back(quad);
            ++numberOfQueries;
        }
        else
        {
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_fVars.set(var);
            linear->_rootID = _queryRootIndex[var];
            _compiler->addQuery(linear);

            listOfQueries.push_back(linear);
            ++numberOfQueries;
        }
        

        for (size_t var2 = var+1; var2 < NUM_OF_VARIABLES; ++var2)
        {
            if (_features[var2])
            {
                //*****************************************//
                prod_bitset prod_quad_v2 = prod_linear_v1;
                
                Aggregate* agg_quad_v2 = new Aggregate();
                
                Query* quad_v2 = new Query();
                quad_v2->_rootID = _td->_root->_id;

                // if (_categoricalFeatures[var])
                // {
                //     quad_v2->_rootID = _queryRootIndex[var];
                //     quad_v2->_fVars.set(var);
                //     if (_categoricalFeatures[var2])
                //     {
                //         quad_v2->_fVars.set(var2);
                //         // If both varaibles are categoricalVars - we choose the
                //         // var2 as the root
                //         // TODO: We should use the root that is highest to the
                //         // original root
                //         if (_queryRootIndex[var2] <= _queryRootIndex[var])
                //             quad_v2->_rootID = _queryRootIndex[var2];
                //     }
                //     else
                //     {
                //         prod_quad_v2.set(featureToFunction[var2]);
                //     }
                // }
                // else if (_categoricalFeatures[var2])
                // {
                //     quad_v2->_fVars.set(var2);
                //     quad_v2->_rootID = _queryRootIndex[var2];
                // }
                // else
                // {
                //     // create prod_quad_v2 of both var and var2
                //     prod_quad_v2.set(featureToFunction[var2]);                    
                // }
                if (_categoricalFeatures[var])
                {
                    quad_v2->_rootID = _queryRootIndex[var];
                    quad_v2->_fVars.set(var);                    
                }
                
                if (_categoricalFeatures[var2])
                {
                    quad_v2->_fVars.set(var2);
                    // If both varaibles are categoricalVars - we choose the
                    // var2 as the root
                    quad_v2->_rootID = _queryRootIndex[var2];
                }
                else
                {
                    // create prod_quad_v2 of both var and var2
                    prod_quad_v2.set(featureToFunction[var2]);                    
                }
                
                agg_quad_v2->_agg.push_back(prod_quad_v2);
                
                quad_v2->_aggregates.push_back(agg_quad_v2);
                _compiler->addQuery(quad_v2);
                
                // TODO: Here we add both sides! multiply var times param of
                // var2 -- add that to gradient of var. And then multiply var2
                // times param of var and add to gradient of var2! -- this can
                // be done togther in one pass over the vector!

                listOfQueries.push_back(quad_v2);                
                ++numberOfQueries;
                // TODO: once we have identified the queries and how they are
                // multiplied, we then need to identify the actual views that
                // are computed over and use the information group computation
                // over this view!
            }
        }
    }
}